

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O1

vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> * __thiscall
ram::MinimizerEngine::Minimize
          (vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
           *__return_storage_ptr__,MinimizerEngine *this,
          unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *sequence,
          bool minhash)

{
  byte *pbVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  NucleicAcid *pNVar4;
  undefined7 in_register_00000009;
  _Elt_pointer pKVar5;
  uint uVar6;
  ulong uVar7;
  _Elt_pointer __args;
  ulong uVar8;
  ulong uVar9;
  _Map_pointer ppKVar10;
  uint uVar11;
  deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> window;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>> *local_b8;
  undefined4 local_ac;
  _Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> local_a8;
  ulong local_50;
  unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *local_48;
  MinimizerEngine *local_40;
  ulong local_38;
  
  if (((sequence->_M_t).
       super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>._M_t.
       super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>.
       super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->inflated_len < this->k_)
  {
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_ac = (undefined4)CONCAT71(in_register_00000009,minhash);
    local_c0 = -1L << ((char)this->k_ * '\x02' & 0x3fU);
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
    uVar11 = 0;
    std::_Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
    _M_initialize_map(&local_a8,0);
    uVar2 = this->k_;
    pNVar4 = (sequence->_M_t).
             super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
             ._M_t.
             super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
             .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl;
    local_50 = (ulong)pNVar4->id;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar6 = pNVar4->inflated_len;
    local_b8 = (vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>> *)
               __return_storage_ptr__;
    if (uVar6 != 0) {
      local_c0 = ~local_c0;
      local_38 = (ulong)(uVar2 * 2 - 2);
      local_50 = local_50 << 0x20;
      uVar7 = 0;
      uVar9 = 0;
      local_48 = sequence;
      local_40 = this;
      do {
        uVar6 = ~uVar11 + uVar6;
        if ((ulong)pNVar4->is_reverse_complement == 0) {
          uVar6 = uVar11;
        }
        uVar8 = (ulong)((uint)(*(ulong *)(*(long *)&(pNVar4->deflated_data).
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data +
                                         (ulong)(uVar6 >> 5) * 8) >> ((char)uVar6 * '\x02' & 0x3fU))
                       & 3) ^ (ulong)pNVar4->is_reverse_complement * 3;
        uVar7 = uVar8 + uVar7 * 4 & local_c0;
        uVar9 = (uVar8 ^ 3) << ((byte)local_38 & 0x3f) | uVar9 >> 2;
        uVar2 = this->k_;
        if (uVar2 - 1 <= uVar11) {
          if (uVar7 < uVar9) {
            uVar8 = uVar7 * 0x200000 + ~uVar7 & local_c0;
            uVar8 = (uVar8 >> 0x18 ^ uVar8) * 0x109 & local_c0;
            uVar8 = (uVar8 >> 0xe ^ uVar8) * 0x15 & local_c0;
            local_d0 = (uVar8 >> 0x1c ^ uVar8) * 0x80000001 & local_c0;
            local_c8 = (ulong)((uVar11 - uVar2) * 2 + 2);
            while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              pKVar5 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pKVar5 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (pKVar5[-1].value <= local_d0) break;
              std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
              pop_back((deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                        *)&local_a8);
            }
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>::
              _M_push_back_aux<unsigned_long&,unsigned_long&>
                        ((deque<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>
                          *)&local_a8,&local_d0,&local_c8);
            }
            else {
LAB_0010bd1b:
              (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->value = local_d0;
              (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->origin = local_c8;
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
          else if (uVar9 < uVar7) {
            uVar8 = uVar9 * 0x200000 + ~uVar9 & local_c0;
            uVar8 = (uVar8 >> 0x18 ^ uVar8) * 0x109 & local_c0;
            uVar8 = (uVar8 >> 0xe ^ uVar8) * 0x15 & local_c0;
            local_d0 = (uVar8 >> 0x1c ^ uVar8) * 0x80000001 & local_c0;
            local_c8 = (ulong)((uVar11 - uVar2) * 2 + 3);
            while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              pKVar5 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pKVar5 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (pKVar5[-1].value <= local_d0) break;
              std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
              pop_back((deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                        *)&local_a8);
            }
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) goto LAB_0010bd1b;
            std::deque<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>::
            _M_push_back_aux<unsigned_long&,unsigned_long&>
                      ((deque<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>
                        *)&local_a8,&local_d0,&local_c8);
          }
        }
        if ((this->k_ + this->w_) - 2 <= uVar11) {
          if ((local_a8._M_impl.super__Deque_impl_data._M_start._M_cur !=
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur) &&
             (__args = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur,
             pKVar5 = local_a8._M_impl.super__Deque_impl_data._M_start._M_last,
             ppKVar10 = local_a8._M_impl.super__Deque_impl_data._M_start._M_node,
             (local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)->value ==
             (local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)->value)) {
            do {
              if (-1 < (long)__args->origin) {
                local_d0 = __args->origin | local_50;
                std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>::
                emplace_back<unsigned_long&,unsigned_long>(local_b8,&__args->value,&local_d0);
                pbVar1 = (byte *)((long)&__args->origin + 7);
                *pbVar1 = *pbVar1 | 0x80;
              }
              __args = __args + 1;
              if (__args == pKVar5) {
                __args = ppKVar10[1];
                ppKVar10 = ppKVar10 + 1;
                pKVar5 = __args + 0x20;
              }
            } while ((__args != local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur) &&
                    (__args->value ==
                     (local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)->value));
          }
          this = local_40;
          sequence = local_48;
          if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            uVar2 = local_40->k_;
            uVar3 = local_40->w_;
            do {
              if ((uVar11 - (uVar2 + uVar3)) + 3 <=
                  (uint)(local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)->origin >> 1)
              break;
              std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
              pop_front((deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                         *)&local_a8);
            } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                     local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
          }
        }
        uVar11 = uVar11 + 1;
        pNVar4 = (sequence->_M_t).
                 super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                 .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl;
        uVar6 = pNVar4->inflated_len;
      } while (uVar11 < uVar6);
    }
    __return_storage_ptr__ =
         (vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *)local_b8
    ;
    if ((char)local_ac != '\0') {
      RadixSort<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Kmer*,std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>>,unsigned_long(*)(ram::MinimizerEngine::Kmer_const&)>
                (*(Kmer **)local_b8,*(Kmer **)(local_b8 + 8),(char)this->k_ * '\x02',
                 Kmer::SortByValue);
      std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::resize
                (__return_storage_ptr__,
                 (ulong)((sequence->_M_t).
                         super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                         .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->
                        inflated_len / (ulong)this->k_);
      RadixSort<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Kmer*,std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>>,unsigned_long(*)(ram::MinimizerEngine::Kmer_const&)>
                (*(Kmer **)__return_storage_ptr__,*(Kmer **)((long)__return_storage_ptr__ + 8),'@',
                 Kmer::SortByOrigin);
    }
    std::_Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
    ~_Deque_base(&local_a8);
  }
  return (vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *)
         (vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>> *)
         __return_storage_ptr__;
}

Assistant:

std::vector<MinimizerEngine::Kmer> MinimizerEngine::Minimize(
    const std::unique_ptr<biosoup::NucleicAcid>& sequence,
    bool minhash) const {
  if (sequence->inflated_len < k_) {
    return std::vector<Kmer>{};
  }

  std::uint64_t mask = (1ULL << (k_ * 2)) - 1;

  auto hash = [&] (std::uint64_t key) -> std::uint64_t {
    key = ((~key) + (key << 21)) & mask;
    key = key ^ (key >> 24);
    key = ((key + (key << 3)) + (key << 8)) & mask;
    key = key ^ (key >> 14);
    key = ((key + (key << 2)) + (key << 4)) & mask;
    key = key ^ (key >> 28);
    key = (key + (key << 31)) & mask;
    return key;
  };

  std::deque<Kmer> window;
  auto window_add = [&] (std::uint64_t value, std::uint64_t location) -> void {
    while (!window.empty() && window.back().value > value) {
      window.pop_back();
    }
    window.emplace_back(value, location);
  };
  auto window_update = [&] (std::uint32_t position) -> void {
    while (!window.empty() && (window.front().position()) < position) {
      window.pop_front();
    }
  };

  std::uint64_t shift = (k_ - 1) * 2;
  std::uint64_t minimizer = 0;
  std::uint64_t reverse_minimizer = 0;
  std::uint64_t id = static_cast<std::uint64_t>(sequence->id) << 32;
  std::uint64_t is_stored = 1ULL << 63;

  std::vector<Kmer> dst;

  for (std::uint32_t i = 0; i < sequence->inflated_len; ++i) {
    std::uint64_t c = sequence->Code(i);
    minimizer = ((minimizer << 2) | c) & mask;
    reverse_minimizer = (reverse_minimizer >> 2) | ((c ^ 3) << shift);
    if (i >= k_ - 1U) {
      if (minimizer < reverse_minimizer) {
        window_add(hash(minimizer), (i - (k_ - 1U)) << 1 | 0);
      } else if (minimizer > reverse_minimizer) {
        window_add(hash(reverse_minimizer), (i - (k_ - 1U)) << 1 | 1);
      }
    }
    if (i >= (k_ - 1U) + (w_ - 1U)) {
      for (auto it = window.begin(); it != window.end(); ++it) {
        if (it->value != window.front().value) {
          break;
        }
        if (it->origin & is_stored) {
          continue;
        }
        dst.emplace_back(it->value, id | it->origin);
        it->origin |= is_stored;
      }
      window_update(i - (k_ - 1U) - (w_ - 1U) + 1);
    }
  }

  if (minhash) {
    RadixSort(dst.begin(), dst.end(), k_ * 2, Kmer::SortByValue);
    dst.resize(sequence->inflated_len / k_);
    RadixSort(dst.begin(), dst.end(), 64, Kmer::SortByOrigin);
  }

  return dst;
}